

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_view_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test::
~iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test
          (iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test *this)

{
  iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test *this_local;
  
  ~iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(UnitTest, PrintStringViewConvertible)
{
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
    LogChecker ck("ABC");
#else
    LogChecker ck("-Byte object");
#endif
    StringViewConvertible v;
    IUTEST_PRINTTOSTRING_CHECK(ck, v);
    IUTEST_STREAMOUT_CHECK(v);
}